

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.hpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
TasGrid::MultiIndexManipulations::referencePoints<true>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,int *levels,
          OneDimensionalWrapper *wrapper,MultiIndexSet *points)

{
  ulong __n;
  ulong uVar1;
  int iVar2;
  pointer piVar3;
  ulong uVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  vector<int,_std::allocator<int>_> p;
  vector<int,_std::allocator<int>_> num_points;
  allocator_type local_61;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  __n = points->num_dimensions;
  ::std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,(allocator_type *)&local_60);
  if (__n != 0) {
    piVar3 = (wrapper->num_points).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4] = piVar3[levels[uVar4]];
      uVar4 = uVar4 + 1;
    } while (__n != uVar4);
  }
  uVar5 = 1;
  for (piVar3 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar3 != local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
    uVar5 = uVar5 * *piVar3;
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)(int)uVar5,(allocator_type *)&local_60);
  ::std::vector<int,_std::allocator<int>_>::vector(&local_60,__n,&local_61);
  if (0 < (int)uVar5) {
    uVar4 = 0;
    do {
      lVar7 = (__n & 0xffffffff) + 1;
      piVar6 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar1 = uVar4;
      if (0 < (int)__n) {
        do {
          piVar6 = piVar6 + -1;
          local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar7 + -2] = (int)uVar1 % *piVar6;
          lVar7 = lVar7 + -1;
          uVar1 = (long)(int)uVar1 / (long)*piVar6;
        } while (1 < lVar7);
      }
      iVar2 = MultiIndexSet::getSlot
                        (points,local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar4] = iVar2;
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar5);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> referencePoints(const int levels[], const OneDimensionalWrapper &wrapper, const MultiIndexSet &points){
    size_t num_dimensions = (size_t) points.getNumDimensions();
    std::vector<int> num_points(num_dimensions);
    int num_total = 1; // this will be a subset of all points, no danger of overflow
    for(size_t j=0; j<num_dimensions; j++) num_points[j] = wrapper.getNumPoints(levels[j]);
    for(auto n : num_points) num_total *= n;

    std::vector<int> refs(num_total);
    std::vector<int> p(num_dimensions);

    for(int i=0; i<num_total; i++){
        int t = i;
        auto n = num_points.rbegin();
        for(int j=(int) num_dimensions-1; j>=0; j--){
            p[j] = (nested) ? t % *n : wrapper.getPointIndex(levels[j], t % *n);
            t /= *n++;
        }
        refs[i] = points.getSlot(p);
    }
    return refs;
}